

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

flat_example * flatten_example(vw *all,example *ec)

{
  bool bVar1;
  uint64_t uVar2;
  weight *pwVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  flat_example *pfVar6;
  char *__dest;
  long lVar7;
  uint32_t *puVar8;
  uint64_t *puVar9;
  full_features_and_source *pfVar10;
  size_t sVar11;
  features *pfVar12;
  byte bVar13;
  full_features_and_source ffs;
  full_features_and_source local_98;
  
  bVar13 = 0;
  pfVar6 = calloc_or_throw<flat_example>(1);
  pwVar4 = (ec->l).cs.costs._end;
  pwVar5 = (ec->l).cs.costs.end_array;
  sVar11 = (ec->l).cs.costs.erase_count;
  (pfVar6->l).multi = (ec->l).multi;
  (pfVar6->l).cs.costs._end = pwVar4;
  (pfVar6->l).cs.costs.end_array = pwVar5;
  (pfVar6->l).cs.costs.erase_count = sVar11;
  (pfVar6->l).cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
  (pfVar6->l).simple.weight = ec->weight;
  sVar11 = (long)(ec->tag)._end - (long)(ec->tag)._begin;
  pfVar6->tag_len = sVar11;
  if (sVar11 != 0) {
    __dest = calloc_or_throw<char>(sVar11 + 1);
    pfVar6->tag = __dest;
    memcpy(__dest,(ec->tag)._begin,pfVar6->tag_len);
  }
  pfVar6->example_counter = ec->example_counter;
  pfVar6->ft_offset = (ec->super_example_predict).ft_offset;
  pfVar6->num_features = ec->num_features;
  local_98.fs.space_names.end_array =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_98.fs.space_names.erase_count = 0;
  local_98.fs.space_names._begin =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_98.fs.space_names._end =
       (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  local_98.fs.indicies.end_array = (unsigned_long *)0x0;
  local_98.fs.indicies.erase_count = 0;
  local_98.fs.indicies._begin = (unsigned_long *)0x0;
  local_98.fs.indicies._end = (unsigned_long *)0x0;
  local_98.fs.values.end_array = (float *)0x0;
  local_98.fs.values.erase_count = 0;
  local_98.fs.values._begin = (float *)0x0;
  local_98.fs.values._end = (float *)0x0;
  local_98.fs.sum_feat_sq = 0.0;
  bVar1 = (all->weights).sparse;
  puVar8 = &(all->weights).dense_weights._stride_shift;
  if (bVar1 != false) {
    puVar8 = &(all->weights).sparse_weights._stride_shift;
  }
  local_98.stride_shift = *puVar8;
  if (bVar1 == true) {
    uVar2 = (all->weights).sparse_weights._weight_mask;
    pwVar3 = (weight *)(all->weights).sparse_weights._map._M_h._M_element_count;
  }
  else {
    uVar2 = (all->weights).dense_weights._weight_mask;
    pwVar3 = (all->weights).dense_weights._begin;
  }
  puVar9 = &(all->weights).dense_weights._weight_mask;
  if (bVar1 != false) {
    puVar9 = &(all->weights).sparse_weights._weight_mask;
  }
  if (pwVar3 == (weight *)0x0 || uVar2 == 0) {
    local_98.mask = 0x7fffffffffffffff;
  }
  else {
    local_98.mask = *puVar9;
  }
  local_98.mask = local_98.mask >> ((byte)local_98.stride_shift & 0x3f);
  GD::foreach_feature<full_features_and_source,_unsigned_long,_&vec_ffs_store>(all,ec,&local_98);
  pfVar10 = &local_98;
  pfVar12 = &pfVar6->fs;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pfVar12->values)._begin = *(float **)pfVar10;
    pfVar10 = (full_features_and_source *)((long)pfVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    pfVar12 = (features *)((long)pfVar12 + (ulong)bVar13 * -0x10 + 8);
  }
  (pfVar6->fs).sum_feat_sq = local_98.fs.sum_feat_sq;
  return pfVar6;
}

Assistant:

flat_example* flatten_example(vw& all, example* ec)
{
  flat_example& fec = calloc_or_throw<flat_example>();
  fec.l = ec->l;
  fec.l.simple.weight = ec->weight;

  fec.tag_len = ec->tag.size();
  if (fec.tag_len > 0)
  {
    fec.tag = calloc_or_throw<char>(fec.tag_len + 1);
    memcpy(fec.tag, ec->tag.begin(), fec.tag_len);
  }

  fec.example_counter = ec->example_counter;
  fec.ft_offset = ec->ft_offset;
  fec.num_features = ec->num_features;

  full_features_and_source ffs;
  ffs.stride_shift = all.weights.stride_shift();
  if (all.weights.not_null())  // TODO:temporary fix. all.weights is not initialized at this point in some cases.
    ffs.mask = (uint64_t)all.weights.mask() >> all.weights.stride_shift();
  else
    ffs.mask = (uint64_t)LONG_MAX >> all.weights.stride_shift();
  GD::foreach_feature<full_features_and_source, uint64_t, vec_ffs_store>(all, *ec, ffs);

  fec.fs = ffs.fs;

  return &fec;
}